

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::OP_SetElementI_UInt32
               (Var instance,uint32 index,Var value,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  BOOL BVar1;
  Var index_00;
  
  index_00 = JavascriptNumber::ToVar(index,scriptContext);
  BVar1 = OP_SetElementI_JIT(instance,index_00,value,scriptContext,flags);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::OP_SetElementI_UInt32(Var instance, uint32 index, Var value, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetElementI_UInt32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_SetElementI_UInt32, Op_SetElementI);
#if FLOATVAR
        return OP_SetElementI_JIT(instance, Js::JavascriptNumber::ToVar(index, scriptContext), value, scriptContext, flags);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_SetElementI_JIT(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), value, scriptContext, flags);
#endif
        JIT_HELPER_END(Op_SetElementI_UInt32);
    }